

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,quath *value)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  half4 local_28;
  half4 v;
  quath *value_local;
  AsciiParser *this_local;
  
  v._M_elems = (_Type)value;
  bVar1 = ReadBasicType(this,&local_28);
  if (bVar1) {
    pvVar2 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_28,0);
    *(uint16_t *)((long)v._M_elems + 6) = pvVar2->value;
    pvVar2 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_28,1);
    pvVar3 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                       ((array<tinyusdz::value::half,_3UL> *)v._M_elems,0);
    pvVar3->value = pvVar2->value;
    pvVar2 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_28,2);
    pvVar3 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                       ((array<tinyusdz::value::half,_3UL> *)v._M_elems,1);
    pvVar3->value = pvVar2->value;
    pvVar2 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_28,3);
    pvVar3 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                       ((array<tinyusdz::value::half,_3UL> *)v._M_elems,2);
    pvVar3->value = pvVar2->value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::quath *value) {
  value::half4 v;
  if (ReadBasicType(&v)) {
    value->real = v[0];
    value->imag[0] = v[1];
    value->imag[1] = v[2];
    value->imag[2] = v[3];
    return true;
  }
  return false;
}